

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O1

feed_db_status_t free_feed_db(feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  
  free(db->path);
  free(db->error_msg);
  iVar1 = sqlite3_close(db->conn);
  db->rc = iVar1;
  if (iVar1 == 0) {
    db->open = 0;
  }
  else {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
  }
  return (uint)(iVar1 == 0);
}

Assistant:

feed_db_status_t free_feed_db(feed_db_t *db) {
    free(db->path);
    free(db->error_msg);

    db->rc = sqlite3_close(db->conn);
    if (db->rc != SQLITE_OK) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        return FEED_DB_ERROR;
    }

    db->open = 0;
    return FEED_DB_SUCCESS;
}